

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::AtHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  double T1;
  int iVar1;
  Var aValue;
  INT64 IVar2;
  undefined4 extraout_var;
  RecyclableObject *pRVar3;
  ulong uVar4;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  
  local_50 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_50)->noJsReentrancy;
  ((ThreadContext *)local_50)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
    uVar4 = 0;
  }
  else {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    aValue = Arguments::operator[](args,1);
    T1 = JavascriptConversion::ToInteger(aValue,scriptContext);
    IVar2 = NumberUtilities::TryToInt64(T1);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    *(bool *)((long)local_50 + 0x108) = true;
    uVar4 = (ulong)((uint)(IVar2 >> 0x3f) & length) + IVar2;
  }
  if (uVar4 < length) {
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pRVar3 = (RecyclableObject *)JavascriptOperators::GetItem(obj,(uint32)uVar4,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
    }
    else {
      iVar1 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase);
      pRVar3 = (RecyclableObject *)CONCAT44(extraout_var,iVar1);
    }
  }
  else {
    pRVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pRVar3;
}

Assistant:

Var JavascriptArray::AtHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        // 3. Let relativeIndex be ? ToInteger(index).
        int64_t relativeIndex = 0;

        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, relativeIndex = NumberUtilities::TryToInt64(JavascriptConversion::ToInteger(args[1], scriptContext)));
        }

        // 4. If relativeIndex >= 0, then
        //     a. Let k be relativeIndex.
        // 5. Else,
        //     a. Let k be len + relativeIndex.
        int64_t k = relativeIndex;
        
        if (relativeIndex < 0)
        {
            k += (int64_t)length;
        }
        
        // 6. If k < 0 or k >= len, then return undefined.
        if (k < 0 || k >= (int64_t)length)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        
        
        if (typedArrayBase)
        {
            // %typedarray%.prototype.at(index): https://tc39.es/proposal-relative-indexing-method/#sec-array.prototype.at
            // 8. Return ? Get(O, ! ToString(k)).
            return typedArrayBase->DirectGetItem((uint32_t)k);
        }
        else
        {
            Var element;
            // 7. Return ? Get(O, ! ToString(k)).
            JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, (T)k, scriptContext));
            return element;
        }
    }